

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

int ffgtrm(fitsfile *gfptr,int rmopt,int *status)

{
  int iVar1;
  ulong uVar2;
  long member;
  ulong uVar3;
  long nmembers;
  int hdutype;
  HDUtracker HDU;
  
  nmembers = 0;
  iVar1 = *status;
  if (iVar1 == 0) {
    if (rmopt == 3) {
      HDU.nHDU = 0;
      uVar2 = 0;
      iVar1 = fftsad(gfptr,&HDU,(int *)0x0,(char *)0x0);
      *status = iVar1;
      iVar1 = ffgtrmr(gfptr,&HDU,status);
      *status = iVar1;
      uVar3 = 0;
      if (0 < HDU.nHDU) {
        uVar3 = (ulong)(uint)HDU.nHDU;
      }
      for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        free(HDU.filename[uVar2]);
        free(HDU.newFilename[uVar2]);
      }
    }
    else if (rmopt == 0) {
      iVar1 = ffgtnm(gfptr,&nmembers,status);
      *status = iVar1;
      member = nmembers;
      while ((0 < member && (iVar1 == 0))) {
        iVar1 = ffgmrm(gfptr,member,1,status);
        *status = iVar1;
        member = member + -1;
      }
    }
    else {
      *status = 0x15b;
      ffpmsg("Invalid value for the rmopt parameter specified (ffgtrm)");
    }
    iVar1 = ffgmul(gfptr,0,status);
    *status = iVar1;
    iVar1 = ffdhdu(gfptr,&hdutype,status);
    *status = iVar1;
  }
  return iVar1;
}

Assistant:

int ffgtrm(fitsfile *gfptr,  /* FITS file pointer to group                   */
	   int       rmopt,  /* code specifying if member
				elements are to be deleted:
				OPT_RM_GPT ==> remove only group table
				OPT_RM_ALL ==> recursively remove members
				and their members (if groups)                */
	   int      *status) /* return status code                           */
	    
/*
  remove a grouping table, and optionally all its members. Any groups 
  containing the grouping table are updated, and all members (if not 
  deleted) have their GRPIDn and GRPLCn keywords updated accordingly. 
  If the (deleted) members are members of another grouping table then those
  tables are also updated. The CHDU of the FITS file pointed to by gfptr must 
  be positioned to the grouping table to be deleted.
*/

{
  int hdutype;

  long i;
  long nmembers = 0;

  HDUtracker HDU;
  

  if(*status != 0) return(*status);

  /*
     remove the grouping table depending upon the rmopt parameter
  */

  switch(rmopt)
    {

    case OPT_RM_GPT:

      /*
	 for this option, the grouping table is deleted, but the member
	 HDUs remain; in this case we only have to remove each member from
	 the grouping table by calling fits_remove_member() with the
	 OPT_RM_ENTRY option
      */

      /* get the number of members contained by this table */

      *status = fits_get_num_members(gfptr,&nmembers,status);

      /* loop over all grouping table members and remove them */

      for(i = nmembers; i > 0 && *status == 0; --i)
	*status = fits_remove_member(gfptr,i,OPT_RM_ENTRY,status);
      
	break;

    case OPT_RM_ALL:

      /*
	for this option the entire Group is deleted -- this includes all
	members and their members (if grouping tables themselves). Call 
	the recursive form of this function to perform the removal.
      */

      /* add the current grouping table to the HDUtracker struct */

      HDU.nHDU = 0;

      *status = fftsad(gfptr,&HDU,NULL,NULL);

      /* call the recursive group remove function */

      *status = ffgtrmr(gfptr,&HDU,status);

      /* free the memory allocated to the HDUtracker struct */

      for(i = 0; i < HDU.nHDU; ++i)
	{
	  free(HDU.filename[i]);
	  free(HDU.newFilename[i]);
	}

      break;

    default:
      
      *status = BAD_OPTION;
      ffpmsg("Invalid value for the rmopt parameter specified (ffgtrm)");
      break;

     }

  /*
     if all went well then unlink and delete the grouping table HDU
  */

  *status = ffgmul(gfptr,0,status);

  *status = fits_delete_hdu(gfptr,&hdutype,status);
      
  return(*status);
}